

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre.h
# Opt level: O2

Matcher * __thiscall
trivialre::re_compiler::C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy>::
CompileOrDie_abi_cxx11_
          (Matcher *__return_storage_ptr__,
          C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy> *this,string_view str)

{
  string_view msg;
  string_view at;
  ParseResult local_58;
  
  *(size_t *)this = str._M_len;
  *(char **)(this + 8) = str._M_str;
  ParseAlt_abi_cxx11_(&local_58,this,str);
  if (local_58.second._M_len != 0) {
    msg._M_str = "failed to parse entire re string";
    msg._M_len = 0x20;
    at._M_str = local_58.second._M_str;
    at._M_len = local_58.second._M_len;
    ErrorPolicy::NoteError((ErrorPolicy *)this,msg,at);
  }
  if (local_58.first.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == false) {
    StringTestingBuilder::Any_abi_cxx11_();
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_58);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

Matcher CompileOrDie(std::string_view str) {
    ErrorPolicy::StartedParsing(str);
    auto [maybe_m, new_str] = ParseAlt(str);
    if (!new_str.empty()) {
      ErrorPolicy::NoteError("failed to parse entire re string", new_str);
    }
    if (!maybe_m) {
      return builder.Any();
    }
    return maybe_m.value();
  }